

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

mp_int monty_reduce_internal(MontyContext *mc,mp_int *x,mp_int scratch)

{
  BignumInt **a;
  mp_int *b;
  mp_int scratch_00;
  mp_int scratch_01;
  uint yes;
  undefined1 local_68 [8];
  mp_int mk;
  mp_int k;
  mp_int x_lo;
  mp_int *x_local;
  MontyContext *mc_local;
  mp_int scratch_local;
  mp_int toret;
  
  scratch_local.nw = (size_t)scratch.w;
  mc_local = (MontyContext *)scratch.nw;
  join_0x00000010_0x00000000_ = mp_make_alias(x,0,mc->rbits);
  join_0x00000010_0x00000000_ = mp_alloc_from_scratch((mp_int *)&mc_local,mc->rw);
  scratch_00.w = (BignumInt *)scratch_local.nw;
  scratch_00.nw = (size_t)mc_local;
  mp_mul_internal((mp_int *)&mk.w,(mp_int *)&k.w,mc->minus_minv_mod_r,scratch_00);
  _local_68 = mp_alloc_from_scratch((mp_int *)&mc_local,mc->pw);
  scratch_01.w = (BignumInt *)scratch_local.nw;
  scratch_01.nw = (size_t)mc_local;
  mp_mul_internal((mp_int *)local_68,mc->m,(mp_int *)&mk.w,scratch_01);
  mp_add_into((mp_int *)local_68,x,(mp_int *)local_68);
  join_0x00000010_0x00000000_ = mp_make_alias((mp_int *)local_68,mc->rw,(long)local_68 - mc->rw);
  b = mc->m;
  a = &scratch_local.w;
  yes = mp_cmp_hs((mp_int *)a,b);
  mp_cond_sub_into((mp_int *)a,(mp_int *)a,b,yes);
  return stack0xffffffffffffffe8;
}

Assistant:

static mp_int monty_reduce_internal(MontyContext *mc, mp_int *x, mp_int scratch)
{
    /*
     * The trick with Montgomery reduction is that on the one hand we
     * want to reduce the size of the input by a factor of about r,
     * and on the other hand, the two numbers we just multiplied were
     * both stored with an extra factor of r multiplied in. So we
     * computed ar*br = ab r^2, but we want to return abr, so we need
     * to divide by r - and if we can do that by _actually dividing_
     * by r then this also reduces the size of the number.
     *
     * But we can only do that if the number we're dividing by r is a
     * multiple of r. So first we must add an adjustment to it which
     * clears its bottom 'rbits' bits. That adjustment must be a
     * multiple of m in order to leave the residue mod n unchanged, so
     * the question is, what multiple of m can we add to x to make it
     * congruent to 0 mod r? And the answer is, x * (-m)^{-1} mod r.
     */

    /* x mod r */
    mp_int x_lo = mp_make_alias(x, 0, mc->rbits);

    /* x * (-m)^{-1}, i.e. the number we want to multiply by m */
    mp_int k = mp_alloc_from_scratch(&scratch, mc->rw);
    mp_mul_internal(&k, &x_lo, mc->minus_minv_mod_r, scratch);

    /* m times that, i.e. the number we want to add to x */
    mp_int mk = mp_alloc_from_scratch(&scratch, mc->pw);
    mp_mul_internal(&mk, mc->m, &k, scratch);

    /* Add it to x */
    mp_add_into(&mk, x, &mk);

    /* Reduce mod r, by simply making an alias to the upper words of x */
    mp_int toret = mp_make_alias(&mk, mc->rw, mk.nw - mc->rw);

    /*
     * We'll generally be doing this after a multiplication of two
     * fully reduced values. So our input could be anything up to m^2,
     * and then we added up to rm to it. Hence, the maximum value is
     * rm+m^2, and after dividing by r, that becomes r + m(m/r) < 2r.
     * So a single trial-subtraction will finish reducing to the
     * interval [0,m).
     */
    mp_cond_sub_into(&toret, &toret, mc->m, mp_cmp_hs(&toret, mc->m));
    return toret;
}